

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::ValuePlusArgsFunction::checkArguments
          (ValuePlusArgsFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  Diagnostic *diag;
  Type *pTVar4;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,2,2);
  if (bVar2) {
    pTVar4 = ((*args->_M_ptr)->type).ptr;
    bVar2 = Type::canBeStringLike(pTVar4);
    if (bVar2) {
      pTVar4 = (args->_M_ptr[1]->type).ptr;
      bVar2 = Type::canBeStringLike(pTVar4);
      if (!bVar2) {
        pTVar3 = pTVar4->canonical;
        if (pTVar3 == (Type *)0x0) {
          Type::resolveCanonical(pTVar4);
          pTVar3 = pTVar4->canonical;
        }
        if ((pTVar3->super_Symbol).kind != FloatingType) {
          pTVar4 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[1]);
          return pTVar4;
        }
      }
      return pCVar1->intType;
    }
    diag = ASTContext::addDiag(context,(DiagCode)0x1b000b,(*args->_M_ptr)->sourceRange);
    ast::operator<<(diag,pTVar4);
  }
  return pCVar1->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 2))
            return comp.getErrorType();

        const Type& ft = *args[0]->type;
        if (!ft.canBeStringLike()) {
            context.addDiag(diag::InvalidStringArg, args[0]->sourceRange) << ft;
            return comp.getErrorType();
        }

        // TODO: if the first argument is known at compile time, do more specific
        // checking of the second argument.
        const Type& st = *args[1]->type;
        if (!st.canBeStringLike() && !st.isFloating())
            return badArg(context, *args[1]);

        return comp.getIntType();
    }